

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O1

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,ClassDeclaration *class_declaration)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  NewScopeLayer *parent;
  NewScopeLayer *this_00;
  Symbol local_98;
  string local_70;
  string local_50;
  
  pcVar2 = (class_declaration->class_name_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (class_declaration->class_name_)._M_string_length);
  Symbol::Symbol(&local_98,&local_50);
  std::__cxx11::string::_M_assign((string *)&this->current_layer_->class_symbol_);
  paVar1 = &local_98.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.name_._M_dataplus._M_p,local_98.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_00 = (NewScopeLayer *)operator_new(0x168);
  parent = this->current_layer_;
  pcVar2 = (class_declaration->class_name_)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (class_declaration->class_name_)._M_string_length);
  local_98.name_.field_2._8_8_ = 0;
  local_98.name_._M_string_length = 0;
  local_98.name_.field_2._M_allocated_capacity = 0;
  local_98.name_._M_dataplus._M_p = (pointer)paVar1;
  NewScopeLayer::NewScopeLayer
            (this_00,parent,&local_70,&this->current_layer_->class_symbol_,&local_98);
  this->current_layer_ = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.name_._M_dataplus._M_p,local_98.name_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  (**(class_declaration->declarations_->super_Statement).super_Node._vptr_Node)
            (class_declaration->declarations_,this);
  this->current_layer_ = this->current_layer_->parent_;
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(ClassDeclaration* class_declaration) {
  current_layer_->class_symbol_ = Symbol(class_declaration->class_name_);
  // PreVisiting checks if class is already declared
  // new scope
  current_layer_ =
      new NewScopeLayer(current_layer_, class_declaration->class_name_,
                        current_layer_->class_symbol_, Symbol());

  class_declaration->declarations_->Accept(this);

  current_layer_ = current_layer_->parent_;
}